

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_pcg.c
# Opt level: O1

int SUNPCGSetPrecType(SUNLinearSolver S,int pretype)

{
  int iVar1;
  
  iVar1 = -2;
  if ((uint)pretype < 4) {
    if (S != (SUNLinearSolver)0x0) {
      *(int *)((long)S->content + 4) = pretype;
      return 0;
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int SUNPCGSetPrecType(SUNLinearSolver S, int pretype)
{ return(SUNLinSol_PCGSetPrecType(S, pretype)); }